

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.cc
# Opt level: O0

void __thiscall
leveldb::InternalKeyComparator::FindShortSuccessor(InternalKeyComparator *this,string *key)

{
  Comparator *pCVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  ulong uVar5;
  uint64_t value;
  bool bVar6;
  Slice local_a0;
  Slice local_90;
  Slice local_80 [2];
  allocator local_59;
  string local_58 [8];
  string tmp;
  Slice local_38;
  undefined1 local_28 [8];
  Slice user_key;
  string *key_local;
  InternalKeyComparator *this_local;
  
  user_key.size_ = (size_t)key;
  Slice::Slice(&local_38,key);
  _local_28 = ExtractUserKey(&local_38);
  pcVar3 = Slice::data((Slice *)local_28);
  sVar4 = Slice::size((Slice *)local_28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,pcVar3,sVar4,&local_59);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  (*this->user_comparator_->_vptr_Comparator[5])(this->user_comparator_,local_58);
  uVar5 = std::__cxx11::string::size();
  sVar4 = Slice::size((Slice *)local_28);
  bVar6 = false;
  if (uVar5 < sVar4) {
    pCVar1 = this->user_comparator_;
    Slice::Slice(local_80,(string *)local_58);
    iVar2 = (*pCVar1->_vptr_Comparator[2])(pCVar1,local_28,local_80);
    bVar6 = iVar2 < 0;
  }
  if (bVar6) {
    value = PackSequenceAndType(0xffffffffffffff,kTypeValue);
    PutFixed64((string *)local_58,value);
    Slice::Slice(&local_90,(string *)user_key.size_);
    Slice::Slice(&local_a0,(string *)local_58);
    iVar2 = (*(this->super_Comparator)._vptr_Comparator[2])(this,&local_90,&local_a0);
    if (-1 < iVar2) {
      __assert_fail("this->Compare(*key, tmp) < 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/plutolove[P]leveldb/db/dbformat.cc"
                    ,0x60,
                    "virtual void leveldb::InternalKeyComparator::FindShortSuccessor(std::string *) const"
                   );
    }
    std::__cxx11::string::swap((string *)user_key.size_);
  }
  std::__cxx11::string::~string(local_58);
  return;
}

Assistant:

void InternalKeyComparator::FindShortSuccessor(std::string *key) const {
        Slice user_key = ExtractUserKey(*key);
        std::string tmp(user_key.data(), user_key.size());
        user_comparator_->FindShortSuccessor(&tmp);
        if (tmp.size() < user_key.size() &&
            user_comparator_->Compare(user_key, tmp) < 0) {
            // User key has become shorter physically, but larger logically.
            // Tack on the earliest possible number to the shortened user key.
            PutFixed64(&tmp, PackSequenceAndType(kMaxSequenceNumber, kValueTypeForSeek));
            assert(this->Compare(*key, tmp) < 0);
            key->swap(tmp);
        }
    }